

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

void __thiscall MemoryMappedFile::MemoryMappedFile(MemoryMappedFile *this,char *filename)

{
  int iVar1;
  uchar *puVar2;
  stat info;
  stat sStack_98;
  
  this->data = (uchar *)0x0;
  this->size = 0;
  iVar1 = open(filename,0);
  this->posix_descriptor = iVar1;
  if (iVar1 != -1) {
    iVar1 = fstat(iVar1,&sStack_98);
    if ((-1 < iVar1) && (-1 < sStack_98.st_size)) {
      this->size = sStack_98.st_size;
      puVar2 = (uchar *)mmap((void *)0x0,sStack_98.st_size,1,1,this->posix_descriptor,0);
      this->data = puVar2;
      if (puVar2 == (uchar *)0x0) {
        __assert_fail("valid()",
                      "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/tinyexr/tinyexr.h"
                      ,0x1a16,"MemoryMappedFile::MemoryMappedFile(const char *)");
      }
    }
  }
  return;
}

Assistant:

MemoryMappedFile(const char *filename) {
    data = NULL;
    size = 0;
#ifdef TINYEXR_USE_WIN32_MMAP
    windows_file_mapping = NULL;
    windows_file =
        CreateFileW(tinyexr::UTF8ToWchar(filename).c_str(),  // lpFileName
                    GENERIC_READ,                            // dwDesiredAccess
                    FILE_SHARE_READ,                         // dwShareMode
                    NULL,                     // lpSecurityAttributes
                    OPEN_EXISTING,            // dwCreationDisposition
                    FILE_ATTRIBUTE_READONLY,  // dwFlagsAndAttributes
                    NULL);                    // hTemplateFile
    if (windows_file == INVALID_HANDLE_VALUE) {
      return;
    }

    windows_file_mapping = CreateFileMapping(windows_file,  // hFile
                                             NULL,  // lpFileMappingAttributes
                                             PAGE_READONLY,  // flProtect
                                             0,      // dwMaximumSizeHigh
                                             0,      // dwMaximumSizeLow
                                             NULL);  // lpName
    if (windows_file_mapping == NULL) {
      return;
    }

    data = reinterpret_cast<unsigned char *>(
        MapViewOfFile(windows_file_mapping,  // hFileMappingObject
                      FILE_MAP_READ,         // dwDesiredAccess
                      0,                     // dwFileOffsetHigh
                      0,                     // dwFileOffsetLow
                      0));                   // dwNumberOfBytesToMap
    if (!data) {
      return;
    }

    LARGE_INTEGER windows_file_size = {};
    if (!GetFileSizeEx(windows_file, &windows_file_size) ||
        static_cast<ULONGLONG>(windows_file_size.QuadPart) >
            std::numeric_limits<size_t>::max()) {
      UnmapViewOfFile(data);
      data = NULL;
      return;
    }
    size = static_cast<size_t>(windows_file_size.QuadPart);
#elif defined(TINYEXR_USE_POSIX_MMAP)
    posix_descriptor = open(filename, O_RDONLY);
    if (posix_descriptor == -1) {
      return;
    }

    struct stat info;
    if (fstat(posix_descriptor, &info) < 0) {
      return;
    }
    // Make sure st_size is in the valid range for a size_t. The second case
    // can only fail if a POSIX implementation defines off_t to be a larger
    // type than size_t - for instance, compiling with _FILE_OFFSET_BITS=64
    // on a 32-bit system. On current 64-bit systems, this check can never
    // fail, so we turn off clang's Wtautological-type-limit-compare warning
    // around this code.
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wtautological-type-limit-compare"
#endif
    if (info.st_size < 0 ||
        info.st_size > std::numeric_limits<ssize_t>::max()) {
      return;
    }
#ifdef __clang__
#pragma clang diagnostic pop
#endif
    size = static_cast<size_t>(info.st_size);

    data = reinterpret_cast<unsigned char *>(
        mmap(0, size, PROT_READ, MAP_SHARED, posix_descriptor, 0));
    if (data == MAP_FAILED) {
      return;
    }
#else
    FILE *fp = fopen(filename, "rb");
    if (!fp) {
      return;
    }

    // Calling fseek(fp, 0, SEEK_END) isn't strictly-conforming C code, but
    // since neither the WIN32 nor POSIX APIs are available in this branch, this
    // is a reasonable fallback option.
    if (fseek(fp, 0, SEEK_END) != 0) {
      fclose(fp);
      return;
    }
    const long ftell_result = ftell(fp);
    if (ftell_result < 0) {
      // Error from ftell
      fclose(fp);
      return;
    }
    size = static_cast<size_t>(ftell_result);
    if (fseek(fp, 0, SEEK_SET) != 0) {
      fclose(fp);
      return;
    }

    data = reinterpret_cast<unsigned char *>(malloc(size));
    if (!data) {
      fclose(fp);
      return;
    }
    size_t read_bytes = fread(data, 1, size, fp);
    assert(read_bytes == size);
    fclose(fp);
    (void)read_bytes;
#endif
    assert(valid());
  }